

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_generator_serialize(secp256k1_context *ctx,uchar *output,secp256k1_generator *gen)

{
  int iVar1;
  undefined1 local_80 [8];
  secp256k1_ge ge;
  secp256k1_generator *gen_local;
  uchar *output_local;
  secp256k1_context *ctx_local;
  
  ge._80_8_ = gen;
  if (output == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (gen == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"gen != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_generator_load((secp256k1_ge *)local_80,gen);
    iVar1 = secp256k1_fe_is_quad_var((secp256k1_fe *)(ge.x.n + 4));
    *output = (byte)iVar1 ^ 0xb;
    secp256k1_fe_normalize_var((secp256k1_fe *)local_80);
    secp256k1_fe_get_b32(output + 1,(secp256k1_fe *)local_80);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_generator_serialize(const secp256k1_context* ctx, unsigned char *output, const secp256k1_generator* gen) {
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(gen != NULL);

    secp256k1_generator_load(&ge, gen);

    output[0] = 11 ^ secp256k1_fe_is_quad_var(&ge.y);
    secp256k1_fe_normalize_var(&ge.x);
    secp256k1_fe_get_b32(&output[1], &ge.x);
    return 1;
}